

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::OnAtomicNotify
          (SharedValidator *this,Location *loc,Opcode opcode,Address alignment)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  Opcode local_ac [9];
  Address local_88;
  Var local_78;
  
  this->expr_loc_ = loc;
  local_ac[0].enum_ = opcode.enum_;
  Var::Var(&local_78,0,loc);
  RVar1 = CheckMemoryIndex(this,&local_78,(MemoryType *)0x0);
  Var::~Var(&local_78);
  Opcode::GetInfo(local_ac);
  RVar2 = CheckAtomicAlign(this,loc,alignment,local_88);
  RVar3 = TypeChecker::OnAtomicNotify(&this->typechecker_,local_ac[0]);
  RVar1.enum_._0_1_ = RVar3.enum_ == Error || (RVar2.enum_ == Error || RVar1.enum_ == Error);
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnAtomicNotify(const Location& loc,
                                       Opcode opcode,
                                       Address alignment) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  result |= CheckMemoryIndex(Var(0, loc));
  result |= CheckAtomicAlign(loc, alignment, opcode.GetMemorySize());
  result |= typechecker_.OnAtomicNotify(opcode);
  return result;
}